

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGC.cpp
# Opt level: O0

void __thiscall
Test_testGarbageCollectionCorrectness17::Run(Test_testGarbageCollectionCorrectness17 *this)

{
  bool bVar1;
  int local_14;
  int t;
  Test_testGarbageCollectionCorrectness17 *this_local;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if ((*(byte *)((long)&Tests::testExecutor + (long)local_14) & 1) != 0) {
      testsCount[local_14] = testsCount[local_14] + 1;
      bVar1 = Tests::RunCode(testGarbageCollectionCorrectness17,testTarget[local_14],"5678",
                             "Garbage collection correctness 17 (unsized array target base is marked and checked as a whole)"
                             ,false);
      if (bVar1) {
        testsPassed[local_14] = testsPassed[local_14] + 1;
      }
    }
  }
  return;
}

Assistant:

const char	*testGarbageCollectionCorrectness18 =
"import std.gc;\r\n\
class Data extendable\r\n\
{\r\n\
	int get(){ return boring; }\r\n\
	int boring;\r\n\
}\r\n\
class HiddenData : Data\r\n\
{\r\n\
	void HiddenData(int x){ value = new int(x); }\r\n\
	int get(){ return *value; }